

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  size_type *psVar3;
  initializer_list<double> percentages;
  vector<DataSet,_std::allocator<DataSet>_> datasets;
  CDT model;
  DataSet dataset;
  undefined1 local_2c8 [36];
  Optimization local_2a4;
  CDT local_298;
  DataSet local_b0;
  
  local_2c8._0_8_ = (DataSet *)(local_2c8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"../examples/","");
  plVar2 = (long *)std::__cxx11::string::append(local_2c8);
  paVar1 = &local_298.m_dataset.m_filepath.field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_298.m_dataset.m_filepath.field_2._M_allocated_capacity = *psVar3;
    local_298.m_dataset.m_filepath.field_2._8_8_ = plVar2[3];
    local_298.m_dataset.m_filepath._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_298.m_dataset.m_filepath.field_2._M_allocated_capacity = *psVar3;
    local_298.m_dataset.m_filepath._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_298.m_dataset.m_filepath._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_2a4.fit_func = 0x1010001;
  DataSet::DataSet(&local_b0,(string *)&local_298,(ReadInfo *)&local_2a4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.m_dataset.m_filepath._M_dataplus._M_p != paVar1) {
    operator_delete(local_298.m_dataset.m_filepath._M_dataplus._M_p,
                    local_298.m_dataset.m_filepath.field_2._M_allocated_capacity + 1);
  }
  if ((DataSet *)local_2c8._0_8_ != (DataSet *)(local_2c8 + 0x10)) {
    operator_delete((void *)local_2c8._0_8_,
                    (ulong)((long)&(((string *)local_2c8._16_8_)->_M_dataplus)._M_p + 1));
  }
  DataSet::shuffle(&local_b0);
  local_298.m_dataset.m_filepath._M_dataplus._M_p = (pointer)0x4049000000000000;
  local_298.m_dataset.m_filepath._M_string_length = 0x4049000000000000;
  percentages._M_len = 2;
  percentages._M_array = (iterator)&local_298;
  DataSet::split((vector<DataSet,_std::allocator<DataSet>_> *)local_2c8,&local_b0,percentages);
  DataSet::dc_sort((DataSet *)local_2c8._0_8_);
  CDT::CDT(&local_298,(DataSet *)local_2c8._0_8_,4,true);
  local_2a4.fit_func = NO_FIT;
  local_2a4.split_dist = HALF;
  local_2a4.confidence = 0x14;
  CDT::optimize(&local_298,&local_2a4);
  CDT::compile(&local_298,3);
  CDT::fit(&local_298);
  CDT::test(&local_298,(ostream *)&std::cout,(DataSet *)local_2c8._0_8_);
  CDT::test(&local_298,(ostream *)&std::cout,(DataSet *)(local_2c8._0_8_ + 0x98));
  CDT::~CDT(&local_298);
  std::vector<DataSet,_std::allocator<DataSet>_>::~vector
            ((vector<DataSet,_std::allocator<DataSet>_> *)local_2c8);
  DataSet::~DataSet(&local_b0);
  return 0;
}

Assistant:

int main(){

    // ReadInfo info{true, true, true, true};

    // DataSet dataset("new.csv", READ(00011));
    // cout<<dataset.labels_string()<<'\n';
    // cout<<dataset<<'\n';

    // vector<DataSet> datasets=dataset.split({20,30,50});
    // for(auto& ds: datasets){
    //     ds.shuffle();
    //     cout<<'\n'<<ds;
    // }

    // datasets[1].save("new.csv", WRITE(000));

    DataSet dataset(EXAMPLE("IRIS.csv"), READ(01011));
    dataset.shuffle();

    std::vector<DataSet> datasets=dataset.split({50,50});
    datasets[0].dc_sort();
    // cout<<datasets[0]<<'\n';

    CDT model(datasets[0], 4, true);
    model.optimize(Optimization{NO_FIT, HALF, 20});
    model.compile();
    // model.train();
    model.fit();

    model.test(cout, datasets[0]);
    // int ans;
    // cout<<"Show activation? ";
    // cin>>ans;
    // if(ans){
    //     std::cout<<"#Params: "<<model.m_function.m_params.size()<<'\n';
    //     for(unsigned i=0;i<model.m_function.m_params.size();++i){
    //         cout<<"Mid: "<<model.m_function.m_params[i].middle<<", ";
    //         cout<<"Len: "<<model.m_function.m_params[i].length<<", ";
    //         cout<<"Amp: "<<model.m_function.m_params[i].amplitude<<", ";
    //         cout<<"Con: "<<model.m_function.m_params[i].confidence<<"\n\n";
    //     }
    // }

    // cout<<"\n > Testing stage:\n";
    // double x;
    // unsigned dim=dataset.shape().n_col-1;
    // vector<double> inps(dim);
    // unsigned i=0;
    // while(cin>>x){
    //     inps[i++]=x;
    //     if(i==dim){
    //         i=0;
    //         cout<<model.predict(inps)<<'\n';
    //     }
    // }
    model.test(cout, datasets[1]);
    // cout<<model;

    return 0;
}